

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  pointer pPVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  CompilerError *this_00;
  pointer pPVar4;
  bool bVar5;
  
  pPVar4 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar1 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pPVar4 == pPVar1) {
      pPVar4 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pPVar4 == pPVar1) {
          return;
        }
        pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + pPVar4->id);
        if (pSVar2->storage != Output) break;
        pSVar2->remapped_variable = true;
        pPVar4 = pPVar4 + 1;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Can only use out variables for PLS outputs.");
LAB_003170f5:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        pPVar4->id);
    if (pSVar2->storage == StorageClassUniformConstant) {
      pSVar3 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar2->super_IVariant).field_0xc);
      bVar5 = (pSVar3->image).dim == DimSubpassData;
    }
    else {
      bVar5 = false;
    }
    if ((pSVar2->storage != Input) && (!bVar5)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Can only use in and target variables for PLS inputs.");
      goto LAB_003170f5;
    }
    pSVar2->remapped_variable = true;
    pPVar4 = pPVar4 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}